

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

VisitError<void> * __thiscall
Fixpp::TypedParsingContext<void>::toVisitError
          (VisitError<void> *__return_storage_ptr__,TypedParsingContext<void> *this)

{
  long lVar1;
  undefined1 local_48 [16];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if ((this->super_ParsingContext).error.empty_ == false) {
    local_48._0_4_ = *(undefined4 *)&(this->super_ParsingContext).error.storage_;
    local_48._4_4_ = *(undefined4 *)((long)&(this->super_ParsingContext).error.storage_ + 4);
    local_48._8_4_ = *(undefined4 *)((long)&(this->super_ParsingContext).error.storage_ + 8);
    local_48._12_4_ = *(undefined4 *)((long)&(this->super_ParsingContext).error.storage_ + 0xc);
    lVar1 = *(long *)((long)&(this->super_ParsingContext).error.storage_ + 0x10);
    local_38._M_p = (pointer)&local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,lVar1,
               *(long *)((long)&(this->super_ParsingContext).error.storage_ + 0x18) + lVar1);
    Fixpp::result::Result<void,_Fixpp::ErrorKind>::Result
              (__return_storage_ptr__,(Err<Fixpp::ErrorKind> *)local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
    }
  }
  else {
    __return_storage_ptr__->ok_ = true;
    (__return_storage_ptr__->storage_).initialized_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

VisitError<void> toVisitError() const
        {
            if (hasError())
                return result::Err(error.get());
            return result::Ok();
        }